

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O0

string * gl3cts::TransformFeedback::Utilities::preprocessCode
                   (string *__return_storage_ptr__,string *source,string *key,string *value)

{
  ulong uVar1;
  string *psVar2;
  size_t position;
  string *value_local;
  string *key_local;
  string *source_local;
  string *destination;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)source);
  while (uVar1 = std::__cxx11::string::find((string *)__return_storage_ptr__,(ulong)key),
        uVar1 != 0xffffffffffffffff) {
    psVar2 = (string *)std::__cxx11::string::size();
    std::__cxx11::string::replace((ulong)__return_storage_ptr__,uVar1,psVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string gl3cts::TransformFeedback::Utilities::preprocessCode(std::string source, std::string key, std::string value)
{
	std::string destination = source;

	while (true)
	{
		/* Find token in source code. */
		size_t position = destination.find(key, 0);

		/* No more occurences of this key. */
		if (position == std::string::npos)
		{
			break;
		}

		/* Replace token with sub_code. */
		destination.replace(position, key.size(), value);
	}

	return destination;
}